

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::FboTestUtil::Texture2DShader::setUniforms
          (Texture2DShader *this,Context *gl,deUint32 program)

{
  long *plVar1;
  ulong *puVar2;
  uint uVar3;
  undefined8 *puVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  string biasName;
  string scaleName;
  string samplerName;
  ulong *local_248;
  long local_240;
  ulong local_238;
  undefined8 uStack_230;
  ulong *local_228;
  long local_220;
  ulong local_218;
  undefined8 uStack_210;
  ulong *local_208;
  long local_200;
  ulong local_1f8 [2];
  long *local_1e8;
  undefined8 local_1e0;
  long local_1d8;
  undefined8 uStack_1d0;
  ulong *local_1c8;
  long local_1c0;
  ulong local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  (*gl->_vptr_Context[0x76])(gl,(ulong)program);
  if (0 < (int)((ulong)((long)(this->m_inputs).
                              super__Vector_base<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_inputs).
                             super__Vector_base<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 2) * 0x38e38e39) {
    lVar5 = 0x14;
    lVar8 = 0;
    do {
      local_228 = &local_218;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"u_sampler","");
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      iVar7 = (int)lVar8;
      std::ostream::operator<<(local_1a8,iVar7);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar6 = 0xf;
      if (local_228 != &local_218) {
        uVar6 = local_218;
      }
      if (uVar6 < (ulong)(local_240 + local_220)) {
        uVar6 = 0xf;
        if (local_248 != &local_238) {
          uVar6 = local_238;
        }
        if (uVar6 < (ulong)(local_240 + local_220)) goto LAB_012cc7c1;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_248,0,(char *)0x0,(ulong)local_228);
      }
      else {
LAB_012cc7c1:
        puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_248);
      }
      local_1e8 = &local_1d8;
      plVar1 = puVar4 + 2;
      if ((long *)*puVar4 == plVar1) {
        local_1d8 = *plVar1;
        uStack_1d0 = puVar4[3];
      }
      else {
        local_1d8 = *plVar1;
        local_1e8 = (long *)*puVar4;
      }
      local_1e0 = puVar4[1];
      *puVar4 = plVar1;
      puVar4[1] = 0;
      *(undefined1 *)plVar1 = 0;
      if (local_248 != &local_238) {
        operator_delete(local_248,local_238 + 1);
      }
      if (local_228 != &local_218) {
        operator_delete(local_228,local_218 + 1);
      }
      local_248 = &local_238;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"u_texScale","");
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::operator<<(local_1a8,iVar7);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar6 = 0xf;
      if (local_248 != &local_238) {
        uVar6 = local_238;
      }
      if (uVar6 < (ulong)(local_200 + local_240)) {
        uVar6 = 0xf;
        if (local_208 != local_1f8) {
          uVar6 = local_1f8[0];
        }
        if (uVar6 < (ulong)(local_200 + local_240)) goto LAB_012cc901;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,(ulong)local_248);
      }
      else {
LAB_012cc901:
        puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_208);
      }
      local_228 = &local_218;
      puVar2 = puVar4 + 2;
      if ((ulong *)*puVar4 == puVar2) {
        local_218 = *puVar2;
        uStack_210 = puVar4[3];
      }
      else {
        local_218 = *puVar2;
        local_228 = (ulong *)*puVar4;
      }
      local_220 = puVar4[1];
      *puVar4 = puVar2;
      puVar4[1] = 0;
      *(undefined1 *)puVar2 = 0;
      if (local_208 != local_1f8) {
        operator_delete(local_208,local_1f8[0] + 1);
      }
      if (local_248 != &local_238) {
        operator_delete(local_248,local_238 + 1);
      }
      local_208 = local_1f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"u_texBias","");
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::operator<<(local_1a8,iVar7);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar6 = 0xf;
      if (local_208 != local_1f8) {
        uVar6 = local_1f8[0];
      }
      if (uVar6 < (ulong)(local_1c0 + local_200)) {
        uVar6 = 0xf;
        if (local_1c8 != local_1b8) {
          uVar6 = local_1b8[0];
        }
        if (uVar6 < (ulong)(local_1c0 + local_200)) goto LAB_012cca54;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,(ulong)local_208);
      }
      else {
LAB_012cca54:
        puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_208,(ulong)local_1c8);
      }
      puVar2 = puVar4 + 2;
      if ((ulong *)*puVar4 == puVar2) {
        local_238 = *puVar2;
        uStack_230 = puVar4[3];
        local_248 = &local_238;
      }
      else {
        local_238 = *puVar2;
        local_248 = (ulong *)*puVar4;
      }
      local_240 = puVar4[1];
      *puVar4 = puVar2;
      puVar4[1] = 0;
      *(undefined1 *)puVar2 = 0;
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8,local_1b8[0] + 1);
      }
      if (local_208 != local_1f8) {
        operator_delete(local_208,local_1f8[0] + 1);
      }
      uVar3 = (*gl->_vptr_Context[0x66])(gl,(ulong)program,local_1e8);
      (*gl->_vptr_Context[0x5b])
                (gl,(ulong)uVar3,
                 (ulong)*(uint *)((long)(((this->m_inputs).
                                          super__Vector_base<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->scale).m_data
                                 + lVar5 + -0x18));
      uVar3 = (*gl->_vptr_Context[0x66])(gl,(ulong)program,local_228);
      (*gl->_vptr_Context[0x5f])
                (gl,(ulong)uVar3,1,
                 (long)(&((this->m_inputs).
                          super__Vector_base<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input>_>
                          ._M_impl.super__Vector_impl_data._M_start)->scale + -2) + 0xc + lVar5);
      uVar3 = (*gl->_vptr_Context[0x66])(gl,(ulong)program,local_248);
      (*gl->_vptr_Context[0x5f])
                (gl,(ulong)uVar3,1,
                 (long)(((this->m_inputs).
                         super__Vector_base<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input>_>
                         ._M_impl.super__Vector_impl_data._M_start)->scale).m_data + lVar5 + -4);
      if (local_248 != &local_238) {
        operator_delete(local_248,local_238 + 1);
      }
      if (local_228 != &local_218) {
        operator_delete(local_228,local_218 + 1);
      }
      if (local_1e8 != &local_1d8) {
        operator_delete(local_1e8,local_1d8 + 1);
      }
      lVar8 = lVar8 + 1;
      lVar5 = lVar5 + 0x24;
    } while (lVar8 < (int)((ulong)((long)(this->m_inputs).
                                         super__Vector_base<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->m_inputs).
                                        super__Vector_base<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles3::Functional::FboTestUtil::Texture2DShader::Input>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                     0x38e38e39);
  }
  uVar3 = (*gl->_vptr_Context[0x66])(gl,(ulong)program,"u_outScale0");
  (*gl->_vptr_Context[0x5f])(gl,(ulong)uVar3,1,&this->m_outScale);
  uVar3 = (*gl->_vptr_Context[0x66])(gl,(ulong)program,"u_outBias0");
  (*gl->_vptr_Context[0x5f])(gl,(ulong)uVar3,1,&this->m_outBias);
  return;
}

Assistant:

void Texture2DShader::setUniforms (sglr::Context& gl, deUint32 program) const
{
	gl.useProgram(program);

	for (int texNdx = 0; texNdx < (int)m_inputs.size(); texNdx++)
	{
		string	samplerName	= string("u_sampler") + de::toString(texNdx);
		string	scaleName	= string("u_texScale") + de::toString(texNdx);
		string	biasName	= string("u_texBias") + de::toString(texNdx);

		gl.uniform1i(gl.getUniformLocation(program, samplerName.c_str()), m_inputs[texNdx].unitNdx);
		gl.uniform4fv(gl.getUniformLocation(program, scaleName.c_str()), 1, m_inputs[texNdx].scale.getPtr());
		gl.uniform4fv(gl.getUniformLocation(program, biasName.c_str()), 1, m_inputs[texNdx].bias.getPtr());
	}

	gl.uniform4fv(gl.getUniformLocation(program, "u_outScale0"), 1, m_outScale.getPtr());
	gl.uniform4fv(gl.getUniformLocation(program, "u_outBias0"), 1, m_outBias.getPtr());
}